

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O3

double __thiscall
anon_unknown.dwarf_1e376::sampleX<Imath_3_2::half>
          (anon_unknown_dwarf_1e376 *this,TypedImageChannel<Imath_3_2::half> *channel,int w,double x
          ,int y,Extrapolation ext)

{
  uint x_00;
  float fVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ushort *puVar5;
  long lVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  
  if (0.0 <= x) {
    uVar7 = (uint)x;
  }
  else {
    dVar8 = -x;
    uVar7 = -((uint)((double)(int)dVar8 < dVar8) + (int)dVar8);
  }
  x_00 = uVar7 + 1;
  switch(ext) {
  case BLACK:
    dVar9 = 0.0;
    dVar8 = 0.0;
    if ((int)uVar7 < w && -1 < (int)uVar7) {
      dVar8 = (double)*(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)
                                        ((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
                                        (ulong)uVar7 * 2 + (long)y * (long)this * 2) * 4);
    }
    if (w <= (int)x_00 || (int)uVar7 < -1) goto LAB_001095be;
    puVar5 = (ushort *)
             ((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
             (ulong)x_00 * 2 + (long)y * (long)this * 2);
    break;
  case CLAMP:
    uVar3 = w - 1;
    uVar4 = uVar3;
    if ((int)uVar7 < (int)uVar3) {
      uVar4 = uVar7;
    }
    if ((int)uVar7 < 0) {
      uVar4 = 0;
    }
    if ((int)x_00 < (int)uVar3) {
      uVar3 = x_00;
    }
    if ((int)uVar7 < -1) {
      uVar3 = 0;
    }
    lVar6 = (long)&(channel->super_ImageChannel)._vptr_ImageChannel + (long)y * (long)this * 2;
    fVar1 = *(float *)(_imath_half_to_float_table +
                      (ulong)*(ushort *)(lVar6 + (long)(int)uVar4 * 2) * 4);
    goto LAB_0010951a;
  case PERIODIC:
    if ((int)uVar7 < 0) {
      if (-1 < w) {
        uVar3 = ((~uVar7 + w) - (~uVar7 + w) % (uint)w) + uVar7;
        if (uVar7 != 0xffffffff) {
          uVar7 = ((w - uVar7) - 2) / (uint)w;
          goto LAB_0010957e;
        }
        goto LAB_00109480;
      }
      uVar3 = uVar7 - ((~w - uVar7) / (uint)-w) * w;
      if (uVar7 == 0xffffffff) goto LAB_00109577;
      uVar7 = (~w - x_00) / (uint)-w;
    }
    else if (w < 0) {
      uVar3 = uVar7 + (uVar7 / (uint)-w) * w;
LAB_00109577:
      uVar7 = x_00 / (uint)-w;
LAB_0010957e:
      uVar7 = -uVar7;
    }
    else {
      uVar3 = uVar7 % (uint)w;
LAB_00109480:
      uVar7 = x_00 / (uint)w;
    }
    dVar8 = (double)*(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)
                                      ((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
                                      (long)(int)uVar3 * 2 + (long)y * (long)this * 2) * 4);
    puVar5 = (ushort *)
             ((long)&(channel->super_ImageChannel)._vptr_ImageChannel +
             (long)(int)(x_00 - uVar7 * w) * 2 + (long)y * (long)this * 2);
    break;
  case MIRROR:
    iVar2 = mirror(uVar7,w);
    uVar3 = mirror(x_00,w);
    lVar6 = (long)&(channel->super_ImageChannel)._vptr_ImageChannel + (long)y * (long)this * 2;
    fVar1 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(lVar6 + (long)iVar2 * 2) * 4)
    ;
LAB_0010951a:
    dVar8 = (double)fVar1;
    puVar5 = (ushort *)(lVar6 + (long)(int)uVar3 * 2);
    break;
  default:
    dVar8 = 0.0;
    dVar9 = 0.0;
    goto LAB_001095be;
  }
  dVar9 = (double)*(float *)(_imath_half_to_float_table + (ulong)*puVar5 * 4);
LAB_001095be:
  return ((double)(int)x_00 - x) * dVar8 + (1.0 - ((double)(int)x_00 - x)) * dVar9;
}

Assistant:

double
sampleX (
    const TypedImageChannel<T>& channel,
    int                         w,
    double                      x,
    int                         y,
    Extrapolation               ext)
{
    //
    // Sample an image channel at location (x, y), where
    // x is a floating point number, and y is an integer.
    //

    int    xs = IMATH_NAMESPACE::floor (x);
    int    xt = xs + 1;
    double s  = xt - x;
    double t  = 1 - s;
    double vs = 0.0;
    double vt = 0.0;

    switch (ext)
    {
        case BLACK:

            vs = (xs >= 0 && xs < w) ? double (channel (xs, y)) : 0.0;
            vt = (xt >= 0 && xt < w) ? double (channel (xt, y)) : 0.0;
            break;

        case CLAMP:

            xs = IMATH_NAMESPACE::clamp (xs, 0, w - 1);
            xt = IMATH_NAMESPACE::clamp (xt, 0, w - 1);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;

        case PERIODIC:

            xs = modp (xs, w);
            xt = modp (xt, w);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;

        case MIRROR:

            xs = mirror (xs, w);
            xt = mirror (xt, w);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;
    }

    return s * vs + t * vt;
}